

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcAlarmType::~IfcAlarmType(IfcAlarmType *this)

{
  ~IfcAlarmType((IfcAlarmType *)
                (&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
                  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
                *(long *)(*(long *)&(this->super_IfcDistributionControlElementType).
                                    super_IfcDistributionElementType.super_IfcElementType.
                                    super_IfcTypeProduct.super_IfcTypeObject + -0x18)));
  return;
}

Assistant:

IfcAlarmType() : Object("IfcAlarmType") {}